

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O2

int duckdb_je_mallctlnametomib(char *name,size_t *mibp,size_t *miblenp)

{
  _Bool _Var1;
  int iVar2;
  tsd_t *tsd;
  
  if (duckdb_je_malloc_init_state != malloc_init_initialized) {
    _Var1 = malloc_init_hard();
    if (_Var1) {
      return 0xb;
    }
  }
  tsd = (tsd_t *)__tls_get_addr(&PTR_027f6b60);
  if ((tsd->state).repr != '\0') {
    tsd = duckdb_je_tsd_fetch_slow(tsd,false);
  }
  iVar2 = duckdb_je_ctl_nametomib(tsd,name,mibp,miblenp);
  return iVar2;
}

Assistant:

JEMALLOC_NOTHROW
je_mallctlnametomib(const char *name, size_t *mibp, size_t *miblenp) {
	int ret;

	LOG("core.mallctlnametomib.entry", "name: %s", name);

	if (unlikely(malloc_init())) {
		LOG("core.mallctlnametomib.exit", "result: %d", EAGAIN);
		return EAGAIN;
	}

	tsd_t *tsd = tsd_fetch();
	check_entry_exit_locking(tsd_tsdn(tsd));
	ret = ctl_nametomib(tsd, name, mibp, miblenp);
	check_entry_exit_locking(tsd_tsdn(tsd));

	LOG("core.mallctlnametomib.exit", "result: %d", ret);
	return ret;
}